

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:546:66)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:546:66)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap_ptr<mjs::global_object> *this_00;
  gc_heap *h;
  value *pvVar1;
  uint32_t uVar2;
  global_object *this_01;
  long *plVar3;
  undefined8 *puVar4;
  void *pvVar5;
  uint32_t index;
  uint uVar6;
  anon_union_32_5_7b1e0779_for_value_3 *this_02;
  gc_heap_ptr<mjs::global_object> global;
  wstring s;
  object_ptr o;
  value v;
  gc_heap_ptr_untyped local_168;
  gc_heap *local_158;
  gc_heap *local_150;
  undefined1 local_148 [24];
  uint32_t local_130;
  gc_heap_ptr_untyped local_128;
  gc_heap *local_118;
  undefined1 local_110 [32];
  value *local_f0;
  gc_heap_ptr_untyped *local_e8;
  value local_e0;
  vector<mjs::value,_std::allocator<mjs::value>_> local_b8;
  pointer local_a0;
  wchar_t *local_98;
  gc_heap_ptr_untyped local_90;
  undefined1 local_80 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_78;
  allocation_context *local_58;
  anon_union_32_5_7b1e0779_for_value_3 local_50;
  
  if ((int)(this->f).version < 2) {
    this_00 = &(this->f).global;
    this_01 = (global_object *)gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
    plVar3 = (long *)gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar3 + 0x70))(&local_e0,plVar3);
    global_object::validate_type(this_01,this_,(object_ptr *)&local_e0,"array");
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0);
  }
  if (this_->type_ == object) {
    h = (this_->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
    this_02 = &this_->field_1;
    puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
    local_118 = (gc_heap *)0x6;
    local_110._0_8_ = L"length";
    (**(code **)*puVar4)(&local_e0,puVar4);
    uVar2 = to_uint32(&local_e0);
    value::destroy(&local_e0);
    local_158 = (gc_heap *)local_148;
    local_150 = (gc_heap *)0x0;
    local_148._0_4_ = 0;
    local_168.heap_ = (this->f).global.super_gc_heap_ptr_untyped.heap_;
    local_168.pos_ = (this->f).global.super_gc_heap_ptr_untyped.pos_;
    local_f0 = __return_storage_ptr__;
    local_e8 = (gc_heap_ptr_untyped *)this_02;
    if (local_168.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_168.heap_,&local_168);
    }
    if (uVar2 != 0) {
      uVar6 = 0;
      do {
        if (uVar6 != 0) {
          std::__cxx11::wstring::append((wchar_t *)&local_158);
        }
        puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(local_e8);
        index_string_abi_cxx11_((wstring *)&local_118,(mjs *)(ulong)uVar6,index);
        local_58 = (allocation_context *)local_110._0_8_;
        local_50.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_118;
        (**(code **)*puVar4)(&local_e0,puVar4,(value *)&local_58);
        if (local_118 != (gc_heap *)(local_110 + 8)) {
          operator_delete(local_118,local_110._8_8_ * 4 + 4);
        }
        if (null < local_e0.type_) {
          plVar3 = (long *)gc_heap_ptr_untyped::get(&local_168);
          (**(code **)(*plVar3 + 0x88))(&local_128,plVar3,&local_e0);
          puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&local_128);
          local_a0 = (pointer)0xe;
          local_98 = L"toLocaleString";
          (**(code **)*puVar4)((value *)&local_58,puVar4,&local_a0);
          local_80._0_4_ = object;
          local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               local_128.heap_;
          local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
               local_128.pos_;
          if (local_128.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_128.heap_,(gc_heap_ptr_untyped *)(local_80 + 8));
          }
          local_b8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          call_function((value *)&local_118,(value *)&local_58,(value *)local_80,&local_b8);
          to_string((mjs *)&local_90,h,(value *)&local_118);
          pvVar5 = gc_heap_ptr_untyped::get(&local_90);
          std::__cxx11::wstring::append((wchar_t *)&local_158,(long)pvVar5 + 4);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
          value::destroy((value *)&local_118);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_b8);
          value::destroy((value *)local_80);
          value::destroy((value *)&local_58);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_128);
        }
        value::destroy(&local_e0);
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
    local_e0._0_8_ = local_150;
    local_e0.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         local_158;
    string::string((string *)(local_148 + 0x10),h,(wstring_view *)&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    pvVar1 = local_f0;
    if (local_158 != (gc_heap *)local_148) {
      operator_delete(local_158,CONCAT44(local_148._4_4_,local_148._0_4_) * 4 + 4);
    }
    pvVar1->type_ = string;
    (pvVar1->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_148._16_8_;
    *(uint32_t *)((long)&pvVar1->field_1 + 8) = local_130;
    if ((slot *)local_148._16_8_ != (slot *)0x0) {
      gc_heap::attach((gc_heap *)local_148._16_8_,(gc_heap_ptr_untyped *)&(pvVar1->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_148 + 0x10));
    return pvVar1;
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }